

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O1

void helper_sve_sel_zpzz_b_aarch64(void *vd,void *vn,void *vm,void *vg,uint32_t desc)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    uVar1 = *(ulong *)((long)vm + uVar2 * 8);
    *(ulong *)((long)vd + uVar2 * 8) =
         (*(ulong *)((long)vn + uVar2 * 8) ^ uVar1) &
         *(ulong *)(expand_pred_b_word + (ulong)*(byte *)((long)vg + uVar2) * 8) ^ uVar1;
    uVar2 = uVar2 + 1;
  } while ((desc & 0x1f) * 8 + 8 >> 3 != uVar2);
  return;
}

Assistant:

void HELPER(sve_sel_zpzz_b)(void *vd, void *vn, void *vm,
                            void *vg, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc) / 8;
    uint64_t *d = vd, *n = vn, *m = vm;
    uint8_t *pg = vg;

    for (i = 0; i < opr_sz; i += 1) {
        uint64_t nn = n[i], mm = m[i];
        uint64_t pp = expand_pred_b(pg[H1(i)]);
        d[i] = (nn & pp) | (mm & ~pp);
    }
}